

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O2

reference __thiscall
jsoncons::jsonpath::detail::
root_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
::evaluate(root_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference param_4,
          result_options options,error_code *ec)

{
  supertype *psVar1;
  bool bVar2;
  int iVar3;
  reference pbVar4;
  undefined4 extraout_var;
  
  bVar2 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
          ::is_cached(context,this->id_);
  if (bVar2) {
    pbVar4 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
             ::get_from_cache(context,this->id_);
    return pbVar4;
  }
  psVar1 = (this->
           super_base_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
           ).tail_;
  if (psVar1 != (supertype *)0x0) {
    iVar3 = (*psVar1->_vptr_jsonpath_selector[3])(psVar1,context,root,last,root,options,ec);
    root = (reference)CONCAT44(extraout_var,iVar3);
  }
  if (ec->_M_value == 0) {
    eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
    ::add_to_cache(context,this->id_,root);
  }
  return root;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference, 
                           result_options options,
                           std::error_code& ec) const override
        {
            if (context.is_cached(id_))
            {
                return context.get_from_cache(id_);
            }
            auto& ref = this->evaluate_tail(context, root, last, root, options, ec);
            if (!ec)
            {
                context.add_to_cache(id_, ref);
            }

            return ref;
        }